

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  char_t *pcVar1;
  char_t *pcVar2;
  byte *s_00;
  bool bVar3;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  s_00 = (byte *)s;
LAB_00156b8b:
  do {
    if (((anonymous_namespace)::chartype_table[*s_00] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[s_00[1]] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_00156be1;
      }
      if (((anonymous_namespace)::chartype_table[s_00[2]] & 1) != 0) {
        s_00 = s_00 + 2;
        goto LAB_00156be1;
      }
      bVar3 = ((anonymous_namespace)::chartype_table[s_00[3]] & 1) == 0;
      if (bVar3) {
        s_00 = s_00 + 4;
      }
      else {
        s_00 = s_00 + 3;
      }
    }
    else {
LAB_00156be1:
      bVar3 = false;
    }
  } while (bVar3);
  if (*s_00 == 0) {
    pcVar1 = gap::flush(&local_28,(char_t *)s_00);
    goto LAB_00156c1a;
  }
  if (*s_00 != 0x3c) {
    s_00 = s_00 + 1;
    goto LAB_00156b8b;
  }
  pcVar1 = gap::flush(&local_28,(char_t *)s_00);
  do {
    pcVar2 = pcVar1;
    if (pcVar2 <= s) break;
    pcVar1 = pcVar2 + -1;
  } while (((anonymous_namespace)::chartype_table[(byte)pcVar2[-1]] & 8) != 0);
  *pcVar2 = '\0';
  return (char_t *)(s_00 + 1);
  while (pcVar1 = pcVar2 + -1, ((anonymous_namespace)::chartype_table[(byte)pcVar2[-1]] & 8) != 0) {
LAB_00156c1a:
    pcVar2 = pcVar1;
    if (pcVar2 <= s) break;
  }
  *pcVar2 = '\0';
  return (char_t *)s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}